

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

ExprNode * __thiscall Translator::visit(Translator *this,PrimaryNode *primaryNode)

{
  TokenNode *pTVar1;
  ExpNode *pEVar2;
  bool bVar3;
  int iVar4;
  VarSymbol *pVVar5;
  undefined4 extraout_var;
  ExprNode *pEVar6;
  Label *pLVar7;
  NAME *pNVar8;
  undefined4 extraout_var_00;
  Literal *this_00;
  byte in_CL;
  double dVar9;
  char name [200];
  char acStack_f8 [208];
  
  pTVar1 = primaryNode->token;
  if ((pTVar1 == (TokenNode *)0x0) || (pTVar1->token != 10)) {
    pEVar2 = primaryNode->exp;
    if (pEVar2 != (ExpNode *)0x0) {
      iVar4 = (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(pEVar2,this);
      return (ExprNode *)CONCAT44(extraout_var,iVar4);
    }
    iVar4 = pTVar1->token;
    if (iVar4 < 0x36) {
      if (iVar4 == 0x1e) {
LAB_00115791:
        this_00 = (Literal *)operator_new(0x18);
        Literal::Literal(this_00,(pTVar1->super_ExpNode).lexeme);
        (this_00->super_Fragment).next = this->fragmentList;
        this->fragmentList = (Fragment *)this_00;
        pNVar8 = (NAME *)operator_new(0x18);
        pLVar7 = (Label *)operator_new(0x10);
        Label::Label(pLVar7,(primaryNode->token->super_ExpNode).lexeme);
        NAME::NAME(pNVar8,pLVar7);
        return &pNVar8->super_ExprNode;
      }
      if (iVar4 == 0x1f) {
        pEVar6 = (ExprNode *)operator_new(0x10);
        CONST::CONST((CONST *)pEVar6,1);
        return pEVar6;
      }
      if (iVar4 == 0x20) {
        pEVar6 = (ExprNode *)operator_new(0x10);
        CONST::CONST((CONST *)pEVar6,0);
        return pEVar6;
      }
    }
    else {
      if (iVar4 == 0x38) goto LAB_00115791;
      if (iVar4 == 0x37) {
        pEVar6 = (ExprNode *)operator_new(0x10);
        dVar9 = atof((pTVar1->super_ExpNode).lexeme);
        CONSTF::CONSTF((CONSTF *)pEVar6,(float)dVar9);
        return pEVar6;
      }
      if (iVar4 == 0x36) {
        pEVar6 = (ExprNode *)operator_new(0x10);
        iVar4 = atoi((pTVar1->super_ExpNode).lexeme);
        CONST::CONST((CONST *)pEVar6,iVar4);
        return pEVar6;
      }
    }
  }
  else {
    if (this->activeFunction != (FunctionSymbol *)0x0) {
      pVVar5 = VarTable::searchInScope
                         (this->varTable,(pTVar1->super_ExpNode).lexeme,
                          (this->activeFunction->super_Symbol).lexeme);
      in_CL = pVVar5 == (VarSymbol *)0x0;
    }
    if ((in_CL & 1) == 0) {
      bVar3 = false;
      iVar4 = (*(this->currentFrame->super_Frame)._vptr_Frame[1])
                        (this->currentFrame,0,(ulong)(uint)primaryNode->token->size);
      this = (Translator *)
             (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar4))
                       ((undefined8 *)CONCAT44(extraout_var_00,iVar4));
    }
    else {
      pVVar5 = VarTable::cSearch(this->varTable,(primaryNode->token->super_ExpNode).lexeme);
      if (pVVar5 == (VarSymbol *)0x0) {
        bVar3 = true;
      }
      else {
        sprintf(acStack_f8,"nonLocal_var_%s",(primaryNode->token->super_ExpNode).lexeme);
        pLVar7 = (Label *)operator_new(0x10);
        Label::Label(pLVar7,acStack_f8);
        this = (Translator *)operator_new(0x18);
        pNVar8 = (NAME *)operator_new(0x18);
        NAME::NAME(pNVar8,pLVar7);
        MEM::MEM((MEM *)this,(ExprNode *)pNVar8);
        bVar3 = false;
      }
    }
    if (!bVar3) {
      return (ExprNode *)this;
    }
  }
  return (ExprNode *)0x0;
}

Assistant:

ExprNode *Translator::visit(PrimaryNode *primaryNode) {//TODO checar casos de arranjos?
    //checa se eh ID
    if (primaryNode->getTokenNode() && primaryNode->getTokenNode()->getToken() == ID) {
        VarSymbol *aux;
        if (activeFunction) {
            aux = varTable->searchInScope(primaryNode->getTokenNode()->getLexeme(), activeFunction->getLexeme());
        }
        if (aux)// variavel local
        {
            //TODO verificar corretude
            LocalAccess *tmp = this->currentFrame->addLocal(false, primaryNode->getTokenNode()->getSize());
            return tmp->accessCode();
//            return new BINOP(PLUS, new TEMP(FP), new CONST(aux->getOffset()));
        } else {
            aux = varTable->cSearch(primaryNode->getTokenNode()->getLexeme());
            if (aux) {// var nonLocal
                char name[200];
                sprintf(name, "nonLocal_var_%s", primaryNode->getTokenNode()->getLexeme());
                Label *labelAUX = new Label(name);
                return new MEM(new NAME(labelAUX));
            }
        }
    } else // nao eh ID
    {
        //checa se eh expressao
        if (primaryNode->getExp()) {
            return primaryNode->getExp()->accept(this);
        }
        //checa se eh um primitivo
        if (primaryNode->getTokenNode()->getToken() == NUMINT) {
            return new CONST(atoi(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == NUMFLOAT) {
            return new CONSTF(atof(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == LITERALCHAR ||
            primaryNode->getTokenNode()->getToken() == LITERAL) {
            Literal *literal = new Literal(primaryNode->getTokenNode()->getLexeme());
            //TODO verificar
            literal->setNext(fragmentList);
            fragmentList = literal;
            return new NAME(new Label(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == TRUE) {
            return new CONST(1);
        }

        if (primaryNode->getTokenNode()->getToken() == FALSE) {
            return new CONST(0);
        }
    }

    return NULL;
}